

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O0

char16_t * icu_63::UCharsTrie::skipValue(char16_t *pos,int32_t leadUnit)

{
  char16_t *pcStack_10;
  int32_t leadUnit_local;
  char16_t *pos_local;
  
  pcStack_10 = pos;
  if (0x3fff < leadUnit) {
    if (leadUnit < 0x7fff) {
      pcStack_10 = pos + 1;
    }
    else {
      pcStack_10 = pos + 2;
    }
  }
  return pcStack_10;
}

Assistant:

static inline const char16_t *skipValue(const char16_t *pos, int32_t leadUnit) {
        if(leadUnit>=kMinTwoUnitValueLead) {
            if(leadUnit<kThreeUnitValueLead) {
                ++pos;
            } else {
                pos+=2;
            }
        }
        return pos;
    }